

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O3

void get_colamd(int m,int n,int_t nnz,int_t *colptr,int_t *rowind,int *perm_c)

{
  int iVar1;
  size_t sVar2;
  int_t *A;
  int_t *p;
  ulong uVar3;
  char msg [256];
  int_t stats [20];
  double knobs [20];
  char local_228 [256];
  int local_128 [20];
  double local_d8 [21];
  
  sVar2 = colamd_recommended(nnz,m,n);
  colamd_set_defaults(local_d8);
  A = intMalloc((int_t)sVar2);
  if (A == (int_t *)0x0) {
    sprintf(local_228,"%s at line %d in file %s\n","Malloc fails for A[]",0x37,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_228);
  }
  p = intMalloc(n + 1U);
  if (p == (int_t *)0x0) {
    sprintf(local_228,"%s at line %d in file %s\n","Malloc fails for p[]",0x38,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_228);
  }
  if (-1 < n) {
    uVar3 = 0;
    do {
      p[uVar3] = colptr[uVar3];
      uVar3 = uVar3 + 1;
    } while (n + 1U != uVar3);
  }
  if (0 < nnz) {
    uVar3 = 0;
    do {
      A[uVar3] = rowind[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)nnz != uVar3);
  }
  iVar1 = colamd(m,n,(int_t)sVar2,A,p,local_d8,local_128);
  if (iVar1 == 0) {
    sprintf(local_228,"%s at line %d in file %s\n","COLAMD failed",0x3f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_228);
  }
  if (0 < n) {
    uVar3 = 0;
    do {
      perm_c[p[uVar3]] = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  superlu_free(A);
  superlu_free(p);
  return;
}

Assistant:

void get_colamd(const int m, const int n, const int_t nnz,
                const int_t *colptr, const int_t *rowind, int *perm_c)
{
    size_t Alen;
    int_t *A, i, *p;
    int info;
    double knobs[COLAMD_KNOBS];
    int_t stats[COLAMD_STATS];

    Alen = COLAMD_recommended(nnz, m, n);

    COLAMD_set_defaults(knobs);

    if ( !(A = intMalloc(Alen)) ) ABORT("Malloc fails for A[]");
    if ( !(p = intMalloc(n+1)) )  ABORT("Malloc fails for p[]");
    for (i = 0; i <= n; ++i) p[i] = colptr[i];
    for (i = 0; i < nnz; ++i) A[i] = rowind[i];
    
    info = COLAMD_MAIN(m, n, Alen, A, p, knobs, stats);

    //printf("after COLAMD_MAIN info %d\n", info);
    if ( info == FALSE ) ABORT("COLAMD failed");

    for (i = 0; i < n; ++i) perm_c[p[i]] = i;

    SUPERLU_FREE(A);
    SUPERLU_FREE(p);
}